

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::BbrDataset&,unsigned_short)>
          (Action<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  undefined1 auStack_78 [40];
  ArgumentTuple local_50;
  undefined1 local_40 [40];
  
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_50.super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>.
  super__Tuple_impl<1UL,_unsigned_short>.super__Head_base<1UL,_unsigned_short,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_short,_false>)
       (args->super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>).
       super__Tuple_impl<1UL,_unsigned_short>.super__Head_base<1UL,_unsigned_short,_false>.
       _M_head_impl;
  local_50.super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>.
  super__Head_base<0UL,_ot::commissioner::BbrDataset_&,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>).
       super__Head_base<0UL,_ot::commissioner::BbrDataset_&,_false>._M_head_impl;
  Action<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::Perform
            ((Result *)auStack_78,action,&local_50);
  ot::commissioner::Error::Error((Error *)local_40,(Error *)auStack_78);
  ActionResultHolder(this,(Wrapper *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(auStack_78 + 8));
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }